

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  void *pvVar5;
  undefined8 uVar6;
  long lVar7;
  char *__s;
  FILE *pFVar8;
  size_t sVar9;
  char *__s2;
  undefined8 *puVar10;
  char *local_48;
  char *local_40;
  long local_38;
  CMimeMessage_T *msg;
  
  lVar3 = cmime_message_new();
  local_48 = (char *)0x0;
  local_40 = (char *)0x0;
  local_38 = lVar3;
  if (argc == 2) {
    pcVar4 = strdup(argv[1]);
    uVar1 = cmime_message_from_file(&local_38,pcVar4,1);
    if (uVar1 == 0) {
      puts("Message summary:\n=========================================");
      pvVar5 = (void *)cmime_message_get_sender_string(local_38);
      uVar6 = cmime_string_strip(pvVar5);
      printf("Sender: [%s]\n",uVar6);
      free(pvVar5);
      printf("Recipients (%d):\n",(ulong)**(uint **)(local_38 + 8));
      for (puVar10 = *(undefined8 **)(*(long *)(local_38 + 8) + 0x10); puVar10 != (undefined8 *)0x0;
          puVar10 = (undefined8 *)puVar10[2]) {
        pvVar5 = (void *)cmime_address_to_string(*puVar10);
        uVar6 = cmime_string_strip(pvVar5);
        printf("- [%s]\n",uVar6);
        free(pvVar5);
      }
      uVar6 = cmime_message_get_mime_version(local_38);
      printf("Mime Version: [%s]\n",uVar6);
      uVar6 = cmime_message_get_content_id(local_38);
      printf("Content ID: [%s]\n",uVar6);
      uVar6 = cmime_message_get_content_type(local_38);
      printf("Content Type: [%s]\n",uVar6);
      printf("Number of message headers: [%d]\n",(ulong)**(uint **)(local_38 + 0x10));
      printf("Number of mime parts: [%d]\n",(ulong)**(uint **)(local_38 + 0x28));
      printf("Message boundary: [%s]\n",*(undefined8 *)(local_38 + 0x18));
      puts("=========================================\n");
      pvVar5 = (void *)cmime_message_to_string(local_38);
      printf("%s",pvVar5);
      free(pvVar5);
    }
    else {
      printf("failed to parse file [%s] [%d]\n",pcVar4,(ulong)uVar1);
    }
    free(pcVar4);
    cmime_message_free(local_38);
    iVar2 = 0;
  }
  else {
    cmime_message_set_sender(lVar3,addr_string1);
    pcVar4 = (char *)cmime_message_get_sender_string(lVar3);
    iVar2 = strcmp(pcVar4,addr_string1);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,addr_string1)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x70,"int main(int, const char **)");
    }
    free(pcVar4);
    cmime_message_set_sender(lVar3,addr_string2);
    pcVar4 = (char *)cmime_message_get_sender_string(lVar3);
    iVar2 = strcmp(pcVar4,addr_string2);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,addr_string2)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x76,"int main(int, const char **)");
    }
    free(pcVar4);
    cmime_message_set_sender_encode(lVar3,addr_string3);
    pcVar4 = (char *)cmime_message_get_sender_string(lVar3);
    iVar2 = strcmp(pcVar4,addr_string3_full_encoded);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,addr_string3_full_encoded)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x7c,"int main(int, const char **)");
    }
    free(pcVar4);
    cmime_message_set_message_id(lVar3,message_id_string);
    pcVar4 = (char *)cmime_message_get_message_id(lVar3);
    iVar2 = strcmp(pcVar4,message_id_string_out);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,message_id_string_out)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x82,"int main(int, const char **)");
    }
    cmime_message_set_subject(lVar3,"A subject  ");
    pcVar4 = (char *)cmime_message_get_subject(lVar3);
    iVar2 = strcmp(pcVar4,"A subject");
    if (iVar2 != 0) {
      __assert_fail("strcmp(s, \"A subject\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x86,"int main(int, const char **)");
    }
    cmime_message_set_subject_encode(lVar3,mime_header_string1);
    pcVar4 = (char *)cmime_message_get_subject(lVar3);
    iVar2 = strcmp(pcVar4,mime_header_string1_b64_encoded);
    if (iVar2 != 0) {
      __assert_fail("strcmp(s,mime_header_string1_b64_encoded)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                    ,0x8a,"int main(int, const char **)");
    }
    iVar2 = cmime_message_set_header(lVar3,header_string1);
    if (iVar2 == 0) {
      uVar6 = cmime_message_get_header(lVar3,header_string1_key);
      pcVar4 = (char *)cmime_header_get_value(uVar6,0);
      iVar2 = strcmp(pcVar4,header_string1_value);
      if (iVar2 != 0) {
        __assert_fail("strcmp(cmime_header_get_value(h,0),header_string1_value)==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                      ,0x90,"int main(int, const char **)");
      }
      iVar2 = cmime_message_set_header(lVar3,header_string1_2);
      if (iVar2 == 0) {
        uVar6 = cmime_message_get_header(lVar3,header_string1_key);
        pcVar4 = (char *)cmime_header_get_value(uVar6,0);
        iVar2 = strcmp(pcVar4,header_string2_value);
        if (iVar2 != 0) {
          __assert_fail("strcmp(cmime_header_get_value(h,0),header_string2_value)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                        ,0x97,"int main(int, const char **)");
        }
        uVar6 = cmime_message_get_header(lVar3,header_string1_key_lower);
        pcVar4 = (char *)cmime_header_get_value(uVar6,0);
        iVar2 = strcmp(pcVar4,header_string2_value);
        if (iVar2 != 0) {
          __assert_fail("strcmp(cmime_header_get_value(h,0),header_string2_value)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                        ,0x9b,"int main(int, const char **)");
        }
        iVar2 = cmime_message_add_recipient(lVar3,addr_string1,0);
        if (((iVar2 == 0) && (iVar2 = cmime_message_add_recipient(lVar3,addr_string2,1), iVar2 == 0)
            ) && (iVar2 = cmime_message_add_recipient_encode(lVar3,addr_string3,0), iVar2 == 0)) {
          lVar7 = *(long *)(lVar3 + 8);
          if (lVar7 == 0) {
            __assert_fail("recipient_list",
                          "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                          ,0xa8,"int main(int, const char **)");
          }
          if (*(undefined8 **)(lVar7 + 0x18) != (undefined8 *)0x0) {
            pcVar4 = (char *)cmime_address_to_string(**(undefined8 **)(lVar7 + 0x18));
            iVar2 = strcmp(pcVar4,addr_string3_full_encoded);
            if (iVar2 != 0) {
              __assert_fail("strcmp(s,addr_string3_full_encoded)==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xad,"int main(int, const char **)");
            }
            free(pcVar4);
          }
          for (puVar10 = *(undefined8 **)(lVar7 + 0x10); puVar10 != (undefined8 *)0x0;
              puVar10 = (undefined8 *)puVar10[2]) {
            pvVar5 = (void *)cmime_address_to_string(*puVar10);
            if (pvVar5 == (void *)0x0) {
              __assert_fail("s",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xb4,"int main(int, const char **)");
            }
            free(pvVar5);
          }
          iVar2 = cmime_message_set_date_now(lVar3);
          if (iVar2 == 0) {
            lVar7 = cmime_message_get_date(lVar3);
            if (lVar7 == 0) {
              __assert_fail("s",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xbe,"int main(int, const char **)");
            }
            pcVar4 = (char *)cmime_message_generate_boundary();
            cmime_message_set_boundary(lVar3,pcVar4);
            local_48 = *(char **)(lVar3 + 0x18);
            iVar2 = strcmp(pcVar4,local_48);
            if (iVar2 != 0) {
              __assert_fail("strcmp(s,s2)==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                            ,0xc4,"int main(int, const char **)");
            }
            free(pcVar4);
            cmime_message_free(lVar3);
            lVar3 = 0;
            while( true ) {
              pcVar4 = test_files[0] + lVar3;
              printf("Checking sample message [%s]...",pcVar4);
              local_38 = cmime_message_new();
              asprintf(&local_40,"%s/%s","samples",pcVar4);
              iVar2 = cmime_message_from_file(&local_38,local_40,0);
              if (iVar2 != 0) {
                return iVar2;
              }
              __s = (char *)cmime_message_to_string(local_38);
              pFVar8 = fopen(local_40,"rb");
              if (pFVar8 == (FILE *)0x0) break;
              free(local_40);
              iVar2 = fseek(pFVar8,0,2);
              if (iVar2 != 0) break;
              sVar9 = ftell(pFVar8);
              rewind(pFVar8);
              __s2 = (char *)calloc(1,sVar9 + 1);
              fread(__s2,sVar9,1,pFVar8);
              iVar2 = ferror(pFVar8);
              if (iVar2 != 0) break;
              fclose(pFVar8);
              asprintf(&local_48,"out_%s",pcVar4);
              pFVar8 = fopen(local_48,"wb");
              sVar9 = strlen(__s);
              fwrite(__s,sVar9,1,pFVar8);
              fclose(pFVar8);
              free(local_48);
              iVar2 = strcmp(__s,__s2);
              if (iVar2 != 0) {
                __assert_fail("strcmp(msg_string,s)==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_message.c"
                              ,0xe9,"int main(int, const char **)");
              }
              free(__s2);
              free(__s);
              cmime_message_free(local_38);
              puts("passed!");
              lVar3 = lVar3 + 10;
              if (lVar3 == 0x21c) {
                return 0;
              }
            }
          }
        }
      }
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main (int argc, char const *argv[]) {
    CMimeMessage_T *msg = cmime_message_new();
    char *s = NULL;
    char *s2 = NULL;
    char *msg_string = NULL;
    char *fname = NULL;
    CMimeHeader_T *h = NULL;
    CMimeList_T *recipient_list = NULL;
    CMimeListElem_T *elem;
    CMimeAddress_T *ca = NULL;
    int retval = 0;
    FILE *fp = NULL;
    FILE *fp2 = NULL;
    long size = 0;
    int i = 0;

    if (argc == 2) {
        /* use message path from command line argument */
        fname = strdup(argv[1]);
        i = cmime_message_from_file(&msg,fname,1);
          
        if (i == 0) {
        
            printf("Message summary:\n=========================================\n");
            s = cmime_message_get_sender_string(msg);
            s2 = cmime_string_strip(s);
            printf("Sender: [%s]\n",s2);
            free(s);
            printf("Recipients (%d):\n",msg->recipients->size);
            elem = cmime_list_head(msg->recipients);
            while(elem != NULL) {
                ca = (CMimeAddress_T *)cmime_list_data(elem);
                s = cmime_address_to_string(ca);
                s2 = cmime_string_strip(s);
                printf("- [%s]\n",s2);
                free(s);
                elem = elem->next;
            }
            printf("Mime Version: [%s]\n",cmime_message_get_mime_version(msg));
            printf("Content ID: [%s]\n",cmime_message_get_content_id(msg));
            printf("Content Type: [%s]\n",cmime_message_get_content_type(msg));
            printf("Number of message headers: [%d]\n",msg->headers->size);
            printf("Number of mime parts: [%d]\n",cmime_message_part_count(msg));
            printf("Message boundary: [%s]\n",cmime_message_get_boundary(msg));
            printf("=========================================\n\n");

            msg_string = cmime_message_to_string(msg);
            printf("%s",msg_string);
            free(msg_string);
        } else {
            printf("failed to parse file [%s] [%d]\n",fname,i);
        } 
        free(fname);
        cmime_message_free(msg);
    } else {
        /* loop test_files */
        cmime_message_set_sender(msg,addr_string1);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string1)==0);
        free(s);
        
        // check if sender will be overwritten
        cmime_message_set_sender(msg,addr_string2);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string2)==0);
        free(s);
        
        // check mime sender header
        cmime_message_set_sender_encode(msg,addr_string3);
        s = cmime_message_get_sender_string(msg);
        assert(strcmp(s,addr_string3_full_encoded)==0);
        free(s);

        // set message id
        cmime_message_set_message_id(msg,message_id_string);
        s = cmime_message_get_message_id(msg);
        assert(strcmp(s,message_id_string_out)==0);
        
        cmime_message_set_subject(msg, "A subject  "); // IMPORTANT: with whitespaces!
        s = cmime_message_get_subject(msg);
        assert(strcmp(s, "A subject") == 0);
        
        cmime_message_set_subject_encode(msg,mime_header_string1);
        s = cmime_message_get_subject(msg);
        assert(strcmp(s,mime_header_string1_b64_encoded)==0);

        // set a test header
        if (cmime_message_set_header(msg, header_string1)!=0) 
            return(-1);
        h = cmime_message_get_header(msg,header_string1_key);
        assert(strcmp(cmime_header_get_value(h,0),header_string1_value)==0);
        
        // overwrite header
        if (cmime_message_set_header(msg, header_string1_2)!=0)
            return(-1);
            
        h = cmime_message_get_header(msg,header_string1_key);
        assert(strcmp(cmime_header_get_value(h,0),header_string2_value)==0);

        // check with lower case key
        h = cmime_message_get_header(msg,header_string1_key_lower);
        assert(strcmp(cmime_header_get_value(h,0),header_string2_value)==0);

        // check recipients
        if (cmime_message_add_recipient(msg,addr_string1,CMIME_ADDRESS_TYPE_TO)!=0)
            return(-1);
        
        if (cmime_message_add_recipient(msg,addr_string2,CMIME_ADDRESS_TYPE_CC)!=0)
            return(-1);
            
        if (cmime_message_add_recipient_encode(msg,addr_string3,CMIME_ADDRESS_TYPE_TO)!=0)
            return(-1);

        recipient_list = cmime_message_get_recipients(msg);
        assert(recipient_list);

        elem = cmime_list_tail(recipient_list);
        if (elem != NULL) {
            s = cmime_address_to_string((CMimeAddress_T *)cmime_list_data(elem));
            assert(strcmp(s,addr_string3_full_encoded)==0);
            free(s);
        }

        elem = cmime_list_head(recipient_list);
        while(elem != NULL) {
            s = cmime_address_to_string((CMimeAddress_T *)cmime_list_data(elem));
            assert(s);
            free(s);
            elem = elem->next;
        }
        
        // checking date
        if (cmime_message_set_date_now(msg)!=0)
            return(-1);
            
        s = cmime_message_get_date(msg);
        assert(s);
                
        // check boundary stuff
        s = cmime_message_generate_boundary();
        cmime_message_set_boundary(msg,s);
        s2 = cmime_message_get_boundary(msg);
        assert(strcmp(s,s2)==0);
        
        free(s);
        cmime_message_free(msg);


        for (i=0; i < 54; i++) {
            printf("Checking sample message [%s]...", test_files[i]);
            
            msg = cmime_message_new();
            asprintf(&fname,"%s/%s",SAMPLES_DIR,test_files[i]);
            retval = cmime_message_from_file(&msg,fname,0);
            if (retval != 0)
                return retval;
                
            msg_string = cmime_message_to_string(msg);
        
            if ((fp = fopen(fname, "rb")) == NULL) 
                return(-1);
            free(fname);    

            if (fseek(fp, 0, SEEK_END)!=0)
                return(-1);
            
            size = ftell(fp);
            rewind(fp); 
            s = (char*) calloc(sizeof(char), size + sizeof(char));
            fread(s, size, 1, fp);
            if(ferror(fp))
                return(-1);
            
            fclose(fp);
            asprintf(&s2,"out_%s",test_files[i]);
            fp2 = fopen(s2,"wb");
            fwrite(msg_string,strlen(msg_string),1,fp2);
            fclose(fp2);
            free(s2);
            assert(strcmp(msg_string,s)==0);
            free(s);
            free(msg_string);
            cmime_message_free(msg);
            printf("passed!\n");
        }
    }
    return(0);
}